

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

void jsoncons::detail::prettify_string<jsoncons::string_sink<std::__cxx11::wstring>>
               (char *buffer,size_t length,int k,int min_exp,int max_exp,
               string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *result)

{
  int iVar1;
  uint uVar2;
  int i;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  int i_1;
  
  iVar1 = (int)length;
  uVar2 = iVar1 + k;
  if ((int)uVar2 <= max_exp && -1 < k) {
    uVar4 = 0;
    uVar6 = 0;
    if (0 < iVar1) {
      uVar6 = length & 0xffffffff;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::push_back(result,(int)buffer[uVar4]);
    }
    for (; (int)length < (int)uVar2; length = (size_t)((int)length + 1)) {
      string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::push_back(result,0x30);
    }
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(result,0x2e);
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(result,0x30);
    return;
  }
  if ((int)uVar2 < 1 || max_exp < (int)uVar2) {
    if ((int)uVar2 <= min_exp || 0 < (int)uVar2) {
      string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::push_back(result,(int)*buffer);
      if (iVar1 != 1) {
        string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::push_back(result,0x2e);
        for (lVar5 = 1; lVar5 < iVar1; lVar5 = lVar5 + 1) {
          string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          ::push_back(result,(int)buffer[lVar5]);
        }
      }
      string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::push_back(result,0x65);
      fill_exponent<jsoncons::string_sink<std::__cxx11::wstring>>(uVar2 - 1,result);
      return;
    }
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(result,0x30);
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(result,0x2e);
    for (iVar3 = 2; iVar3 < (int)(2 - uVar2); iVar3 = iVar3 + 1) {
      string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::push_back(result,0x30);
    }
    uVar4 = 0;
    uVar6 = 0;
    if (0 < iVar1) {
      uVar6 = length & 0xffffffff;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::push_back(result,(int)buffer[uVar4]);
    }
  }
  else {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::push_back(result,(int)buffer[uVar4]);
    }
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(result,0x2e);
    pcVar7 = buffer + uVar2;
    for (; (int)uVar2 < iVar1; uVar2 = uVar2 + 1) {
      string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::push_back(result,(int)*pcVar7);
      pcVar7 = pcVar7 + 1;
    }
  }
  return;
}

Assistant:

void prettify_string(const char *buffer, std::size_t length, int k, int min_exp, int max_exp, Result& result)
    {
        int nb_digits = (int)length;
        int offset;
        /* v = buffer * 10^k
           kk is such that 10^(kk-1) <= v < 10^kk
           this way kk gives the position of the decimal point.
        */
        int kk = nb_digits + k;

        if (nb_digits <= kk && kk <= max_exp)
        {
            /* the first digits are already in. Add some 0s and call it a day. */
            /* the max_exp is a personal choice. Only 16 digits could possibly be relevant.
             * Basically we want to print 12340000000 rather than 1234.0e7 or 1.234e10 */
            for (int i = 0; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
            for (int i = nb_digits; i < kk; ++i)
            {
                result.push_back('0');
            }
            result.push_back('.');
            result.push_back('0');
        } 
        else if (0 < kk && kk <= max_exp)
        {
            /* comma number. Just insert a '.' at the correct location. */
            for (int i = 0; i < kk; ++i)
            {
                result.push_back(buffer[i]);
            }
            result.push_back('.');
            for (int i = kk; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
        } 
        else if (min_exp < kk && kk <= 0)
        {
            offset = 2 - kk;

            result.push_back('0');
            result.push_back('.');
            for (int i = 2; i < offset; ++i) 
                result.push_back('0');
            for (int i = 0; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
        } 
        else if (nb_digits == 1)
        {
            result.push_back(buffer[0]);
            result.push_back('e');
            fill_exponent(kk - 1, result);
        } 
        else
        {
            result.push_back(buffer[0]);
            result.push_back('.');
            for (int i = 1; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
            result.push_back('e');
            fill_exponent(kk - 1, result);
        }
    }